

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O2

int read_int(char **token)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  
  skip_spaces(token);
  pcVar7 = *token;
  cVar1 = *pcVar7;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    pcVar7 = pcVar7 + 1;
    *token = pcVar7;
  }
  ppuVar4 = __ctype_b_loc();
  lVar6 = (long)*pcVar7;
  uVar2 = (*ppuVar4)[lVar6];
  if ((uVar2 >> 0xb & 1) != 0) {
    iVar5 = 0;
    while (pcVar7 = pcVar7 + 1, (uVar2 >> 0xb & 1) != 0) {
      iVar5 = iVar5 * 10 + (int)(char)lVar6 + -0x30;
      *token = pcVar7;
      lVar6 = (long)*pcVar7;
      uVar2 = (*ppuVar4)[lVar6];
    }
    iVar3 = -iVar5;
    if (cVar1 != '-') {
      iVar3 = iVar5;
    }
    return iVar3;
  }
  printf("Parsing error. Unexpected char: %c.\n");
  exit(1);
}

Assistant:

static int read_int(char **token)
{
    int value = 0;
    int neg = 0;

    skip_spaces(token);
    if (**token == '-') {
        neg = 1;
        (*token)++;
    } else if (**token == '+')
        (*token)++;

    if (!isdigit(**token)) {
        printf("Parsing error. Unexpected char: %c.\n", **token);
        exit(EXIT_FAILURE);
    }
    while (isdigit(**token)) {
        value = (value * 10) + (**token - '0');
        (*token)++;
    }
    return neg ? -value : value;
}